

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O0

void avro::codec_traits<uau::_union_array_union_Union__1__>::encode
               (Encoder *e,_union_array_union_Union__1__ *v)

{
  size_t sVar1;
  _union_array_union_Union__1__ *in_RSI;
  _union_array_union_Union__1__ *in_RDI;
  _union_array_union_Union__1__ *this;
  Encoder *e_00;
  Encoder local_28 [32];
  
  this = in_RDI;
  sVar1 = uau::_union_array_union_Union__1__::idx(in_RSI);
  (*(code *)(((_Vector_base<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
               *)&in_RDI->idx_)->_M_impl).super__Vector_impl_data._M_start[10].idx_)(in_RDI,sVar1);
  sVar1 = uau::_union_array_union_Union__1__::idx(in_RSI);
  if (sVar1 == 0) {
    (**(code **)(this->idx_ + 0x20))();
  }
  else if (sVar1 == 1) {
    e_00 = local_28;
    uau::_union_array_union_Union__1__::get_array(this);
    encode<std::vector<uau::_union_array_union_Union__0__,std::allocator<uau::_union_array_union_Union__0__>>>
              (e_00,(vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
                     *)this);
    std::
    vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
    ::~vector((vector<uau::_union_array_union_Union__0__,_std::allocator<uau::_union_array_union_Union__0__>_>
               *)in_RDI);
  }
  return;
}

Assistant:

static void encode(Encoder& e, uau::_union_array_union_Union__1__ v) {
        e.encodeUnionIndex(v.idx());
        switch (v.idx()) {
        case 0:
            e.encodeNull();
            break;
        case 1:
            avro::encode(e, v.get_array());
            break;
        }
    }